

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hpp
# Opt level: O0

void Arguments::declare(bool *ref,char *helpText,char *longTrigger,char *shortTrigger)

{
  Descriptor *this;
  RefAction<bool> *this_00;
  Descriptor *local_88;
  String local_70;
  String local_60 [2];
  VerySimpleReadOnlyString local_40;
  Descriptor *local_30;
  Descriptor *desc;
  char *shortTrigger_local;
  char *longTrigger_local;
  char *helpText_local;
  bool *ref_local;
  
  desc = (Descriptor *)shortTrigger;
  shortTrigger_local = longTrigger;
  longTrigger_local = helpText;
  helpText_local = ref;
  this = (Descriptor *)operator_new(0x38);
  Strings::VerySimpleReadOnlyString::VerySimpleReadOnlyString(&local_40,longTrigger_local,-1);
  if (desc == (Descriptor *)0x0) {
    local_88 = (Descriptor *)0x13c96e;
  }
  else {
    local_88 = desc;
  }
  Bstrlib::String::String(local_60,(char *)local_88);
  Bstrlib::String::String(&local_70,shortTrigger_local);
  Descriptor::Descriptor(this,&local_40,local_60,&local_70,0);
  Bstrlib::String::~String(&local_70);
  Bstrlib::String::~String(local_60);
  Strings::VerySimpleReadOnlyString::~VerySimpleReadOnlyString(&local_40);
  local_30 = this;
  this_00 = (RefAction<bool> *)operator_new(0x18);
  RefAction<bool>::RefAction(this_00,(bool *)helpText_local);
  Core::registerDescriptorAndAction(this,(BaseAction *)this_00);
  return;
}

Assistant:

inline void declare(bool & ref, const char * helpText, const char * longTrigger, const char * shortTrigger = 0)
    {
        // First create the descriptor
        Descriptor * desc = new Descriptor(helpText, shortTrigger ? shortTrigger : "", longTrigger, 0);
        Core::registerDescriptorAndAction(desc, new RefAction<bool>(ref));
    }